

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

int amqp_os_socket_setsockblock(int sock,int block)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = fcntl(sock,3,0);
  if ((int)uVar1 < 0) {
    uVar1 = 0xfffffff7;
  }
  else {
    uVar3 = (ulong)(uVar1 & 0x7ffff7ff);
    if (block == 0) {
      uVar3 = (ulong)uVar1 | 0x800;
    }
    iVar2 = fcntl(sock,4,uVar3);
    uVar1 = iVar2 >> 0x1f & 0xfffffff7;
  }
  return uVar1;
}

Assistant:

static int
amqp_os_socket_setsockblock(int sock, int block)
{

#ifdef _WIN32
  int nonblock = !block;
  if (NO_ERROR != ioctlsocket(sock, FIONBIO, &nonblock)) {
    return AMQP_STATUS_SOCKET_ERROR;
  } else {
    return AMQP_STATUS_OK;
  }
#else
  long arg;

  if ((arg = fcntl(sock, F_GETFL, NULL)) < 0) {
     return AMQP_STATUS_SOCKET_ERROR;
  }

  if (block) {
    arg &= (~O_NONBLOCK);
  } else {
    arg |= O_NONBLOCK;
  }

  if (fcntl(sock, F_SETFL, arg) < 0) {
    return AMQP_STATUS_SOCKET_ERROR;
  }

  return AMQP_STATUS_OK;
#endif
}